

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

FIOBJ http_mimetype_find(char *file_ext,size_t file_ext_len)

{
  int *piVar1;
  uint64_t uVar2;
  ulong uVar3;
  FIOBJ FVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  fio_mime_set__map_s_ *pfVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar2 = fio_siphash13(file_ext,file_ext_len,0,0);
  if (fio_http_mime_types.map != (fio_mime_set__map_s_ *)0x0) {
    uVar6 = -(ulong)(uVar2 == 0) | uVar2;
    if ((fio_http_mime_types.has_collisions != '\0') &&
       (fio_http_mime_types.pos != fio_http_mime_types.count)) {
      fio_mime_set_rehash((fio_mime_set_s *)file_ext);
    }
    bVar11 = false;
    uVar5 = 0;
    if (fio_http_mime_types.used_bits != '\0') {
      uVar5 = uVar6;
    }
    uVar3 = ~(-1L << (fio_http_mime_types.used_bits & 0x3f));
    uVar5 = uVar5 ^ (uVar6 >> (fio_http_mime_types.used_bits & 0x3f) |
                    uVar6 << 0x40 - (fio_http_mime_types.used_bits & 0x3f));
    uVar8 = uVar5 & uVar3;
    if (fio_http_mime_types.map[uVar8].hash == uVar6 || fio_http_mime_types.map[uVar8].hash == 0) {
      pfVar9 = fio_http_mime_types.map + uVar8;
    }
    else {
      pfVar9 = (fio_mime_set__map_s_ *)(fio_http_mime_types.capa >> 2);
      uVar8 = 0x420;
      if (fio_http_mime_types.capa < 0x181) {
        uVar8 = (long)pfVar9 * 0xb;
      }
      uVar10 = 0;
      while (bVar11 = uVar8 <= uVar10, !bVar11) {
        uVar7 = uVar5 + 0xb + uVar10 & uVar3;
        pfVar9 = fio_http_mime_types.map + uVar7;
        bVar11 = false;
        if ((fio_http_mime_types.map[uVar7].hash == 0) ||
           (uVar10 = uVar10 + 0xb, fio_http_mime_types.map[uVar7].hash == uVar6)) break;
      }
    }
    if (!bVar11) goto LAB_00149056;
  }
  pfVar9 = (fio_mime_set__map_s_ *)0x0;
LAB_00149056:
  if ((pfVar9 == (fio_mime_set__map_s_ *)0x0) || (pfVar9->pos == (fio_mime_set__ordered_s_ *)0x0)) {
    FVar4 = 0;
  }
  else {
    FVar4 = pfVar9->pos->obj;
  }
  if ((((~(uint)FVar4 & 6) != 0) && (FVar4 != 0)) && ((FVar4 & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((FVar4 & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return FVar4;
}

Assistant:

FIOBJ http_mimetype_find(char *file_ext, size_t file_ext_len) {
  uintptr_t hash = FIO_HASH_FN(file_ext, file_ext_len, 0, 0);
  return fiobj_dup(
      fio_mime_set_find(&fio_http_mime_types, hash, FIOBJ_INVALID));
}